

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O0

const_strarray *
cfg_db_get_entry_value(cfg_db *db,char *section_type,char *section_name,char *entry_name)

{
  cfg_entry *pcVar1;
  avl_node *local_68;
  cfg_entry *entry;
  cfg_schema_entry *s_entry;
  cfg_schema_entry_key key;
  char *entry_name_local;
  char *section_name_local;
  char *section_type_local;
  cfg_db *db_local;
  
  key.entry = entry_name;
  pcVar1 = cfg_db_find_entry(db,section_type,section_name,entry_name);
  if (pcVar1 == (cfg_entry *)0x0) {
    if ((section_name == (char *)0x0) ||
       (pcVar1 = cfg_db_find_entry(db,section_type,(char *)0x0,key.entry),
       pcVar1 == (cfg_entry *)0x0)) {
      if (db->schema == (cfg_schema *)0x0) {
        db_local = (cfg_db *)0x0;
      }
      else {
        key.type = key.entry;
        s_entry = (cfg_schema_entry *)section_type;
        local_68 = avl_find(&db->schema->entries,&s_entry);
        if (local_68 == (avl_node *)0x0) {
          local_68 = (avl_node *)0x0;
        }
        if ((local_68 == (avl_node *)0x0) || (local_68[1].left == (avl_node *)0x0)) {
          db_local = (cfg_db *)0x0;
        }
        else {
          db_local = (cfg_db *)&local_68[1].left;
        }
      }
    }
    else {
      db_local = (cfg_db *)&pcVar1->val;
    }
  }
  else {
    db_local = (cfg_db *)&pcVar1->val;
  }
  return (const_strarray *)db_local;
}

Assistant:

const struct const_strarray *
cfg_db_get_entry_value(struct cfg_db *db, const char *section_type, const char *section_name, const char *entry_name) {
  struct cfg_schema_entry_key key;
  struct cfg_schema_entry *s_entry;
  struct cfg_entry *entry;

  entry = cfg_db_find_entry(db, section_type, section_name, entry_name);
  if (entry != NULL) {
    return (const struct const_strarray *)&entry->val;
  }

  /* look for value of default section */
  if (section_name != NULL) {
    entry = cfg_db_find_entry(db, section_type, NULL, entry_name);
    if (entry != NULL) {
      return (const struct const_strarray *)&entry->val;
    }
  }

  /* look for schema default value */
  if (db->schema == NULL) {
    return NULL;
  }

  key.type = section_type;
  key.entry = entry_name;

  s_entry = avl_find_element(&db->schema->entries, &key, s_entry, _node);
  if (s_entry != NULL && s_entry->def.value != NULL) {
    return &s_entry->def;
  }
  return NULL;
}